

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O2

command __thiscall Editor::checkCommand(Editor *this,string *input)

{
  bool bVar1;
  command cVar2;
  regex insertNumExpr;
  regex insertExpr;
  regex deleteNumMExpr;
  regex deleteNumExpr;
  regex deleteExpr;
  regex listNumMExpr;
  regex listNumExpr;
  regex listExpr;
  
  bVar1 = std::operator==(input,"E");
  if (bVar1) {
    cVar2 = cmdE;
  }
  else {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&listExpr,"[L]",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&listNumExpr,"[L][\\s][0-9]+",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&listNumMExpr,"[L][\\s][0-9]+[\\s][0-9]+",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&deleteExpr,"[D]",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&deleteNumExpr,"[D][\\s][0-9]+",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&deleteNumMExpr,"[D][\\s][0-9]+[\\s][0-9]+",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&insertExpr,"[I]",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&insertNumExpr,"[I][\\s][0-9]+",0x10);
    cVar2 = cmdL;
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (input,&listExpr,0);
    if (!bVar1) {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (input,&deleteExpr,0);
      if (bVar1) {
        cVar2 = cmdD;
      }
      else {
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (input,&insertExpr,0);
        if (bVar1) {
          cVar2 = cmdI;
        }
        else {
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            (input,&listNumExpr,0);
          if (bVar1) {
            cVar2 = cmdLn;
          }
          else {
            bVar1 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                              (input,&deleteNumExpr,0);
            if (bVar1) {
              cVar2 = cmdDn;
            }
            else {
              bVar1 = std::
                      regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                (input,&insertNumExpr,0);
              if (bVar1) {
                cVar2 = cmdIn;
              }
              else {
                bVar1 = std::
                        regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                  (input,&listNumMExpr,0);
                if (bVar1) {
                  cVar2 = cmdLnm;
                }
                else {
                  bVar1 = std::
                          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    (input,&deleteNumMExpr,0);
                  cVar2 = (uint)!bVar1 * 4 + cmdDnm;
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&insertNumExpr)
    ;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&insertExpr);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (&deleteNumMExpr);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&deleteNumExpr)
    ;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&deleteExpr);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&listNumMExpr);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&listNumExpr);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&listExpr);
  }
  return cVar2;
}

Assistant:

command Editor::checkCommand(const std::string &input) {

    // If the command is E, return right away.
    if (input == "E") return cmdE;

    // Else define regex expression for each command
    std::regex listExpr("[L]"); // Just an L
    std::regex listNumExpr("[L][\\s][0-9]+"); // L followed by whitespace followed by any number of digits
    std::regex listNumMExpr("[L][\\s][0-9]+[\\s][0-9]+"); // L -> space -> any num of digits -> space -> any num of digits

    std::regex deleteExpr("[D]");
    std::regex deleteNumExpr("[D][\\s][0-9]+");
    std::regex deleteNumMExpr("[D][\\s][0-9]+[\\s][0-9]+");

    std::regex insertExpr("[I]");
    std::regex insertNumExpr("[I][\\s][0-9]+");

    // Return corresponding enum for the expression
    if (regex_match(input, listExpr)) return cmdL;
    if (regex_match(input, deleteExpr)) return cmdD;
    if (regex_match(input, insertExpr)) return cmdI;
    if (regex_match(input, listNumExpr)) return cmdLn;
    if (regex_match(input, deleteNumExpr)) return cmdDn;
    if (regex_match(input, insertNumExpr)) return cmdIn;
    if (regex_match(input, listNumMExpr)) return cmdLnm;
    if (regex_match(input, deleteNumMExpr)) return cmdDnm;

    return cmdNone;
}